

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseSDDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  xmlParserErrors code;
  int iVar4;
  
  xmlSkipBlankChars(ctxt);
  pxVar2 = ctxt->input;
  pxVar3 = pxVar2->cur;
  iVar4 = -2;
  if (*pxVar3 != 's') {
    return -2;
  }
  if (pxVar3[1] != 't') {
    return -2;
  }
  if (pxVar3[2] != 'a') {
    return -2;
  }
  if (pxVar3[3] != 'n') {
    return -2;
  }
  if (pxVar3[4] != 'd') {
    return -2;
  }
  if (pxVar3[5] != 'a') {
    return -2;
  }
  if (pxVar3[6] != 'l') {
    return -2;
  }
  if (pxVar3[7] != 'o') {
    return -2;
  }
  if (pxVar3[8] != 'n') {
    return -2;
  }
  if (pxVar3[9] != 'e') {
    return -2;
  }
  pxVar2->cur = pxVar3 + 10;
  pxVar2->col = pxVar2->col + 10;
  if (pxVar3[10] == '\0') {
    xmlParserGrow(ctxt);
  }
  xmlSkipBlankChars(ctxt);
  if (*ctxt->input->cur == '=') {
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
    xVar1 = *ctxt->input->cur;
    if (xVar1 == '\"') {
      xmlNextChar(ctxt);
      pxVar2 = ctxt->input;
      pxVar3 = pxVar2->cur;
      if (*pxVar3 == 'y') {
        if ((pxVar3[1] == 'e') && (pxVar3[2] == 's')) {
          pxVar2->cur = pxVar3 + 3;
          pxVar2->col = pxVar2->col + 3;
          iVar4 = 1;
          xVar1 = pxVar3[3];
          goto joined_r0x0013bcce;
        }
LAB_0013bcda:
        xmlFatalErr(ctxt,XML_ERR_STANDALONE_VALUE,(char *)0x0);
        iVar4 = -2;
      }
      else {
        if ((*pxVar3 != 'n') || (pxVar3[1] != 'o')) goto LAB_0013bcda;
        pxVar2->cur = pxVar3 + 2;
        pxVar2->col = pxVar2->col + 2;
        iVar4 = 0;
        xVar1 = pxVar3[2];
joined_r0x0013bcce:
        if (xVar1 == '\0') {
          xmlParserGrow(ctxt);
        }
      }
      if (*ctxt->input->cur != '\"') goto LAB_0013bcf7;
    }
    else {
      if (xVar1 != '\'') {
        code = XML_ERR_STRING_NOT_STARTED;
        goto LAB_0013bcf9;
      }
      xmlNextChar(ctxt);
      pxVar2 = ctxt->input;
      pxVar3 = pxVar2->cur;
      if (*pxVar3 == 'y') {
        if ((pxVar3[1] == 'e') && (pxVar3[2] == 's')) {
          pxVar2->cur = pxVar3 + 3;
          pxVar2->col = pxVar2->col + 3;
          iVar4 = 1;
          xVar1 = pxVar3[3];
          goto joined_r0x0013bc7c;
        }
LAB_0013bc88:
        xmlFatalErr(ctxt,XML_ERR_STANDALONE_VALUE,(char *)0x0);
        iVar4 = -2;
      }
      else {
        if ((*pxVar3 != 'n') || (pxVar3[1] != 'o')) goto LAB_0013bc88;
        pxVar2->cur = pxVar3 + 2;
        pxVar2->col = pxVar2->col + 2;
        iVar4 = 0;
        xVar1 = pxVar3[2];
joined_r0x0013bc7c:
        if (xVar1 == '\0') {
          xmlParserGrow(ctxt);
        }
      }
      if (*ctxt->input->cur != '\'') {
LAB_0013bcf7:
        code = XML_ERR_STRING_NOT_CLOSED;
        goto LAB_0013bcf9;
      }
    }
    xmlNextChar(ctxt);
  }
  else {
    code = XML_ERR_EQUAL_REQUIRED;
LAB_0013bcf9:
    xmlFatalErr(ctxt,code,(char *)0x0);
  }
  return iVar4;
}

Assistant:

int
xmlParseSDDecl(xmlParserCtxtPtr ctxt) {
    int standalone = -2;

    SKIP_BLANKS;
    if (CMP10(CUR_PTR, 's', 't', 'a', 'n', 'd', 'a', 'l', 'o', 'n', 'e')) {
	SKIP(10);
        SKIP_BLANKS;
	if (RAW != '=') {
	    xmlFatalErr(ctxt, XML_ERR_EQUAL_REQUIRED, NULL);
	    return(standalone);
        }
	NEXT;
	SKIP_BLANKS;
        if (RAW == '\''){
	    NEXT;
	    if ((RAW == 'n') && (NXT(1) == 'o')) {
	        standalone = 0;
                SKIP(2);
	    } else if ((RAW == 'y') && (NXT(1) == 'e') &&
	               (NXT(2) == 's')) {
	        standalone = 1;
		SKIP(3);
            } else {
		xmlFatalErr(ctxt, XML_ERR_STANDALONE_VALUE, NULL);
	    }
	    if (RAW != '\'') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
	    } else
	        NEXT;
	} else if (RAW == '"'){
	    NEXT;
	    if ((RAW == 'n') && (NXT(1) == 'o')) {
	        standalone = 0;
		SKIP(2);
	    } else if ((RAW == 'y') && (NXT(1) == 'e') &&
	               (NXT(2) == 's')) {
	        standalone = 1;
                SKIP(3);
            } else {
		xmlFatalErr(ctxt, XML_ERR_STANDALONE_VALUE, NULL);
	    }
	    if (RAW != '"') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
	    } else
	        NEXT;
	} else {
	    xmlFatalErr(ctxt, XML_ERR_STRING_NOT_STARTED, NULL);
        }
    }
    return(standalone);
}